

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int unqliteBuiltin_db_fetch_all(jx9_context *pCtx,int argc,jx9_value **argv)

{
  int iVar1;
  sxi32 sVar2;
  char *pcVar3;
  unqlite_col *pCol;
  jx9_value *pValue;
  jx9_value *pValue_00;
  int iFlag;
  SyString *pFuncName;
  jx9_vm *pVm;
  jx9_value *pFunc;
  int nByte;
  jx9_value *apArg [2];
  SyString sName;
  uint local_9c;
  anon_union_8_3_18420de5_for_x local_98;
  undefined8 uStack_90;
  jx9_vm *local_88;
  jx9_vm *pjStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  jx9_value *local_58 [3];
  SyString local_40;
  
  if (argc < 1) {
    pVm = pCtx->pVm;
    pFuncName = &pCtx->pFunc->sName;
    pcVar3 = "Missing collection name";
  }
  else {
    pcVar3 = jx9_value_to_string(*argv,(int *)&local_9c);
    if ((int)local_9c < 1) {
      pVm = pCtx->pVm;
      pFuncName = &pCtx->pFunc->sName;
      pcVar3 = "Invalid collection name";
    }
    else {
      local_40.nByte = local_9c;
      local_40.zString = pcVar3;
      pCol = unqliteCollectionFetch((unqlite_vm *)pCtx->pFunc->pUserData,&local_40,iFlag);
      if (pCol == (unqlite_col *)0x0) goto LAB_00117cfa;
      pValue = jx9_context_new_array(pCtx);
      pValue_00 = jx9_context_new_scalar(pCtx);
      pVm = pCtx->pVm;
      local_98.rVal = 0.0;
      local_78 = 0;
      uStack_70 = 0;
      local_68 = 0;
      uStack_60 = 0;
      uStack_90 = 0x20;
      local_88 = pVm;
      pjStack_80 = pVm;
      if (pValue_00 != (jx9_value *)0x0 && pValue != (jx9_value *)0x0) {
        if ((argc == 1) || (iVar1 = jx9VmIsCallable(argv[1]->pVm,argv[1]), iVar1 == 0)) {
          pFunc = (jx9_value *)0x0;
        }
        else {
          pFunc = argv[1];
        }
        pCol->nCurid = 0;
        iVar1 = unqliteCollectionFetchNextRecord(pCol,pValue_00);
        if (iVar1 == 0) {
          do {
            if ((pFunc == (jx9_value *)0x0) ||
               (local_58[0] = pValue_00,
               sVar2 = jx9VmCallUserFunction(pCtx->pVm,pFunc,1,local_58,(jx9_value *)&local_98),
               sVar2 != 0)) {
LAB_00117d83:
              if ((pValue->iFlags & 0x40) != 0) {
                HashmapInsert((jx9_hashmap *)(pValue->x).pOther,(jx9_value *)0x0,pValue_00);
              }
              jx9MemObjRelease(pValue_00);
            }
            else {
              jx9MemObjToBool((jx9_value *)&local_98);
              if (local_98.iVal._0_4_ != 0) goto LAB_00117d83;
              unqliteCollectionCacheRemoveRecord(pCol,pCol->nCurid + -1);
            }
            iVar1 = unqliteCollectionFetchNextRecord(pCol,pValue_00);
          } while (iVar1 == 0);
        }
        jx9MemObjRelease((jx9_value *)&local_98);
        jx9_result_value(pCtx,pValue);
        return 0;
      }
      pFuncName = &pCtx->pFunc->sName;
      pcVar3 = "Jx9 is running out of memory";
    }
  }
  jx9VmThrowError(pVm,pFuncName,1,pcVar3);
LAB_00117cfa:
  jx9MemObjRelease(pCtx->pRet);
  return 0;
}

Assistant:

static int unqliteBuiltin_db_fetch_all(jx9_context *pCtx,int argc,jx9_value **argv)
{
	unqlite_col *pCol;
	const char *zName;
	unqlite_vm *pVm;
	SyString sName;
	int nByte;
	int rc;
	/* Extract collection name */
	if( argc < 1 ){
		/* Missing arguments */
		jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Missing collection name");
		/* Return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	zName = jx9_value_to_string(argv[0],&nByte);
	if( nByte < 1){
		jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Invalid collection name");
		/* Return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	SyStringInitFromBuf(&sName,zName,nByte);
	pVm = (unqlite_vm *)jx9_context_user_data(pCtx);
	/* Fetch the collection */
	pCol = unqliteCollectionFetch(pVm,&sName,UNQLITE_VM_AUTO_LOAD);
	if( pCol ){
		jx9_value *pValue,*pArray,*pCallback = 0;
		jx9_value sResult; /* Callback result */
		/* Allocate an empty scalar value and an empty JSON array */
		pArray = jx9_context_new_array(pCtx);
		pValue = jx9_context_new_scalar(pCtx);
		jx9MemObjInit(pCtx->pVm,&sResult);
		if( pValue == 0 || pArray == 0 ){
			jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Jx9 is running out of memory");
			jx9_result_null(pCtx);
			return JX9_OK;
		}
		if( argc > 1 && jx9_value_is_callable(argv[1]) ){
			pCallback = argv[1];
		}
		unqliteCollectionResetRecordCursor(pCol);
		/* Fetch collection records one after one */
		while( UNQLITE_OK == unqliteCollectionFetchNextRecord(pCol,pValue) ){
			if( pCallback ){
				jx9_value *apArg[2];
				/* Invoke the filter callback */
				apArg[0] = pValue;
				rc = jx9VmCallUserFunction(pCtx->pVm,pCallback,1,apArg,&sResult);
				if( rc == JX9_OK ){
					int iResult; /* Callback result */
					/* Extract callback result */
					iResult = jx9_value_to_bool(&sResult);
					if( !iResult ){
						/* Discard the result */
						unqliteCollectionCacheRemoveRecord(pCol,unqliteCollectionCurrentRecordId(pCol) - 1);
						continue;
					}
				}
			}
			/* Put the value in the JSON array */
			jx9_array_add_elem(pArray,0,pValue);
			/* Release the value */
			jx9_value_null(pValue);
		}
		jx9MemObjRelease(&sResult);
		/* Finally, return our array */
		jx9_result_value(pCtx,pArray);
		/* pValue will be automatically released as soon we return from
		 * this foreign function.
		 */
	}else{
		/* No such collection, return null */
		jx9_result_null(pCtx);
	}
	return JX9_OK;
}